

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

char * resultFilename(char *filename,char *out,char *suffix)

{
  int iVar1;
  char *pcVar2;
  char local_428 [8];
  char suffixbuff [500];
  char local_228 [8];
  char res [500];
  char *base;
  char *suffix_local;
  char *out_local;
  char *filename_local;
  
  pcVar2 = baseFilename(filename);
  base = suffix;
  if (suffix == (char *)0x0) {
    base = ".tmp";
  }
  suffix_local = out;
  if (out == (char *)0x0) {
    suffix_local = "";
  }
  strncpy(local_428,base,499);
  iVar1 = snprintf(local_228,499,"%s%s%s",suffix_local,pcVar2,local_428);
  if (0x1f2 < iVar1) {
    res[0x1eb] = '\0';
  }
  pcVar2 = strdup(local_228);
  return pcVar2;
}

Assistant:

static char *resultFilename(const char *filename, const char *out,
                            const char *suffix) {
    const char *base;
    char res[500];
    char suffixbuff[500];

/*************
    if ((filename[0] == 't') && (filename[1] == 'e') &&
        (filename[2] == 's') && (filename[3] == 't') &&
	(filename[4] == '/'))
	filename = &filename[5];
 *************/

    base = baseFilename(filename);
    if (suffix == NULL)
        suffix = ".tmp";
    if (out == NULL)
        out = "";

    strncpy(suffixbuff,suffix,499);
#ifdef VMS
    if(strstr(base,".") && suffixbuff[0]=='.')
      suffixbuff[0]='_';
#endif

    if (snprintf(res, 499, "%s%s%s", out, base, suffixbuff) >= 499)
        res[499] = 0;
    return(strdup(res));
}